

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void init_proc_745(CPUPPCState_conflict2 *env)

{
  int nb_ways;
  CPUPPCState_conflict3 *__mptr;
  int nb_tlbs;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  gen_spr_7xx(env);
  gen_spr_G2_755(env);
  gen_tbl(env);
  gen_spr_thrm(env);
  _spr_register(env,0x3f0,"HID0",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3f1,"HID1",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  nb_tlbs = 0x3f3;
  _spr_register(env,0x3f3,"HID2",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  gen_low_BATs(env);
  gen_high_BATs(env);
  gen_6xx_7xx_soft_tlb(env,nb_tlbs,nb_ways);
  init_excp_7x5(env);
  env->dcache_line_size = 0x20;
  env->icache_line_size = 0x20;
  ppc6xx_irq_init_ppc64((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
  return;
}

Assistant:

static void init_proc_745(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_7xx(env);
    gen_spr_G2_755(env);
    /* Time base */
    gen_tbl(env);
    /* Thermal management */
    gen_spr_thrm(env);
    /* Hardware implementation registers */
    /* XXX : not implemented */
    spr_register(env, SPR_HID0, "HID0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID1, "HID1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID2, "HID2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Memory management */
    gen_low_BATs(env);
    gen_high_BATs(env);
    gen_6xx_7xx_soft_tlb(env, 64, 2);
    init_excp_7x5(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}